

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

pair<ska::detailv3::sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>::templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
::emplace_new_key<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>
          (sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          pair<slang::parsing::TokenKind,_slang::parsing::Token> *key)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>::templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_bool>
  pVar6;
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>::templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_bool>
  pVar7;
  bool local_79;
  templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_> local_78;
  iterator result;
  value_type to_insert;
  templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_> local_50 [3];
  pair<slang::parsing::TokenKind,_slang::parsing::Token> *local_38;
  pair<slang::parsing::TokenKind,_slang::parsing::Token> *key_local;
  EntryPointer current_entry_local;
  sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
  *psStack_20;
  int8_t distance_from_desired_local;
  sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>
  *this_local;
  bool local_10;
  
  local_38 = key;
  key_local = (pair<slang::parsing::TokenKind,_slang::parsing::Token> *)current_entry;
  current_entry_local._7_1_ =
       (sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
        )distance_from_desired;
  psStack_20 = this;
  if ((*(long *)(this + 0x10) != 0) &&
     ((sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
       )distance_from_desired != this[0x19])) {
    lVar3 = *(long *)(this + 0x20) + 1;
    auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = 0x45300000;
    lVar2 = *(long *)(this + 0x10) + 1;
    auVar5._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar5._0_8_ = lVar2;
    auVar5._12_4_ = 0x45300000;
    if ((auVar4._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0) <=
        ((auVar5._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) *
        (double)*(float *)(this + 0x1c)) {
      bVar1 = sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>::
              is_empty(current_entry);
      if (bVar1) {
        sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>::
        emplace<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>
                  ((sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>> *)
                   key_local,(int8_t)current_entry_local._7_1_,local_38);
        *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
        sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>
        ::templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>::
        templated_iterator(local_50,(EntryPointer)key_local);
        to_insert.second.info._7_1_ = 1;
        std::
        pair<ska::detailv3::sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>::templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_bool>
        ::pair<bool,_true>((pair<ska::detailv3::sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>::templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_bool>
                            *)&this_local,local_50,(bool *)((long)&to_insert.second.info + 7));
        pVar6._8_8_ = extraout_RDX;
        pVar6.first.current = (EntryPointer)this_local;
      }
      else {
        result.current = *(EntryPointer *)local_38;
        to_insert.first = (local_38->second).kind;
        to_insert._2_1_ = (local_38->second).field_0x2;
        to_insert._3_1_ = (local_38->second).numFlags;
        to_insert._4_4_ = (local_38->second).rawLen;
        to_insert.second._0_8_ = (local_38->second).info;
        std::swap<signed_char>((char *)((long)&current_entry_local + 7),(char *)key_local);
        std::swap<slang::parsing::TokenKind,slang::parsing::Token>
                  ((pair<slang::parsing::TokenKind,_slang::parsing::Token> *)&result,
                   (pair<slang::parsing::TokenKind,_slang::parsing::Token> *)&key_local->second);
        sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>
        ::templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>::
        templated_iterator(&local_78,(EntryPointer)key_local);
        current_entry_local._7_1_ =
             (sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
              )((char)current_entry_local._7_1_ + '\x01');
        do {
          while( true ) {
            key_local = (pair<slang::parsing::TokenKind,_slang::parsing::Token> *)
                        &key_local[1].second;
            bVar1 = sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>
                    ::is_empty((sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>
                                *)key_local);
            if (bVar1) {
              sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>::
              emplace<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>
                        ((sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>
                          *)key_local,(int8_t)current_entry_local._7_1_,
                         (pair<slang::parsing::TokenKind,_slang::parsing::Token> *)&result);
              *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
              local_79 = true;
              std::
              pair<ska::detailv3::sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>::templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_bool>
              ::
              pair<ska::detailv3::sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>::templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>_&,_bool,_true>
                        ((pair<ska::detailv3::sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>::templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_bool>
                          *)&this_local,&local_78,&local_79);
              pVar6._8_8_ = extraout_RDX_00;
              pVar6.first.current = (EntryPointer)this_local;
              goto LAB_00561a11;
            }
            if ((char)current_entry_local._7_1_ <= (char)key_local->first) break;
            std::swap<signed_char>((char *)((long)&current_entry_local + 7),(char *)key_local);
            std::swap<slang::parsing::TokenKind,slang::parsing::Token>
                      ((pair<slang::parsing::TokenKind,_slang::parsing::Token> *)&result,
                       (pair<slang::parsing::TokenKind,_slang::parsing::Token> *)&key_local->second)
            ;
            current_entry_local._7_1_ =
                 (sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
                  )((char)current_entry_local._7_1_ + '\x01');
          }
          current_entry_local._7_1_ =
               (sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
                )((char)current_entry_local._7_1_ + '\x01');
        } while (current_entry_local._7_1_ != this[0x19]);
        std::swap<slang::parsing::TokenKind,slang::parsing::Token>
                  ((pair<slang::parsing::TokenKind,_slang::parsing::Token> *)&result,
                   &((local_78.current)->field_1).value);
        sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>
        ::grow((sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>
                *)this);
        pVar6 = emplace<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>
                          (this,(pair<slang::parsing::TokenKind,_slang::parsing::Token> *)&result);
        local_10 = pVar6.second;
      }
      goto LAB_00561a11;
    }
  }
  sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>
  ::grow((sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>
          *)this);
  pVar6 = emplace<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>(this,local_38);
  local_10 = pVar6.second;
LAB_00561a11:
  this_local = (sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>
                *)pVar6.first.current;
  pVar7._9_7_ = pVar6._9_7_;
  pVar7.second = local_10;
  pVar7.first.current = (EntryPointer)this_local;
  return pVar7;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }